

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int __thiscall AActor::CallDoSpecialDamage(AActor *this,AActor *target,int damage,FName *damagetype)

{
  VMFunction *func;
  PClass *pPVar1;
  VMFrameStack *this_00;
  long lVar2;
  int retval;
  int local_8c;
  VMReturn ret;
  VMValue params [4];
  
  if ((CallDoSpecialDamage::VIndex == 0xffffffff) &&
     (CallDoSpecialDamage::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"DoSpecialDamage"),
     CallDoSpecialDamage::VIndex == 0xffffffff)) {
    __assert_fail("VIndex != ~0u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1ba8,"int AActor::CallDoSpecialDamage(AActor *, int, FName)");
  }
  pPVar1 = DObject::GetClass((DObject *)this);
  if ((CallDoSpecialDamage::VIndex < (pPVar1->Virtuals).Count) &&
     (func = (pPVar1->Virtuals).Array[CallDoSpecialDamage::VIndex], func != (VMFunction *)0x0)) {
    params[0].field_0._8_4_ = 1;
    params[0].field_0.field_3.Type = '\x03';
    params[1].field_0.field_3.Type = '\x03';
    params[2].field_0.field_3.Type = '\0';
    params[3].field_0._0_4_ = damagetype->Index;
    params[3].field_0.field_3.Type = '\0';
    ret.Location = &retval;
    ret.TagOfs = 0;
    ret.RegType = '\0';
    params[0].field_0._0_8_ = this;
    params[1].field_0._0_8_ = target;
    params[1].field_0._8_4_ = params[0].field_0._8_4_;
    params[2].field_0._0_4_ = damage;
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,func,params,4,&ret,1,(VMException **)0x0);
    lVar2 = 0x30;
    do {
      VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar2));
      lVar2 = lVar2 + -0x10;
    } while (lVar2 != -0x10);
  }
  else {
    local_8c = damagetype->Index;
    retval = (*(this->super_DThinker).super_DObject._vptr_DObject[0x10])
                       (this,target,(ulong)(uint)damage);
  }
  return retval;
}

Assistant:

int AActor::CallDoSpecialDamage(AActor *target, int damage, FName damagetype)
{
	IFVIRTUAL(AActor, DoSpecialDamage)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[4] = { (DObject*)this, (DObject*)target, damage, damagetype.GetIndex() };
		VMReturn ret;
		int retval;
		ret.IntAt(&retval);
		GlobalVMStack.Call(func, params, 4, &ret, 1, nullptr);
		return retval;
	}
	else return DoSpecialDamage(target, damage, damagetype);

}